

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

uint64_t bitset_clear_list(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  uint uVar1;
  uint64_t in_RCX;
  uint16_t *in_RDX;
  uint64_t in_RSI;
  uint64_t *in_RDI;
  undefined8 local_8;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) == 0) {
    local_8 = _scalar_bitset_clear_list(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  else {
    local_8 = _asm_bitset_clear_list(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

uint64_t bitset_clear_list(uint64_t *words, uint64_t card, const uint16_t *list,
                           uint64_t length) {
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        return _asm_bitset_clear_list(words, card, list, length);
    } else {
        return _scalar_bitset_clear_list(words, card, list, length);
    }
}